

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavFileWriter.h
# Opt level: O0

WavFileWriter * __thiscall
WavFileWriter::OpenWrite
          (WavFileWriter *this,AudioDescriptor *ADesc,char *file_root,SplitType_t split)

{
  Rational RVar1;
  Rational RVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ui32_t uVar9;
  int iVar10;
  ILogSink *this_00;
  WavFileElement *pWVar11;
  undefined4 in_register_0000000c;
  char *pcVar12;
  int in_R8D;
  bool bVar13;
  FileWriter local_770 [104];
  SimpleRF64Header local_708 [8];
  SimpleRF64Header Wav_1;
  undefined1 auStack_6e8 [8];
  AudioDescriptor tmpDesc_1;
  allocator<char> local_6a9;
  string local_6a8 [32];
  string local_688 [104];
  WavFileElement *local_620;
  uint local_614;
  FileWriter local_610 [4];
  ui32_t i;
  SimpleRF64Header local_5a8 [8];
  SimpleRF64Header Wav;
  undefined1 auStack_588 [8];
  AudioDescriptor tmpDesc;
  string local_550 [32];
  string local_530 [104];
  WavFileElement *local_4c8;
  uint local_4bc;
  undefined4 local_4b8;
  ui32_t element_size;
  Result_t local_4a8 [8];
  Result_t result;
  uint local_43c;
  char local_438 [4];
  ui32_t file_count;
  char filename [1024];
  SplitType_t split_local;
  char *file_root_local;
  AudioDescriptor *ADesc_local;
  WavFileWriter *this_local;
  
  pcVar12 = (char *)CONCAT44(in_register_0000000c,split);
  if (pcVar12 == (char *)0x0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
    return this;
  }
  if (*pcVar12 == '\0') {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_NULL_STR);
    return this;
  }
  local_43c = 0;
  Kumu::Result_t::Result_t(local_4a8,(Result_t *)Kumu::RESULT_OK);
  RVar1 = *(Rational *)file_root;
  RVar2 = *(Rational *)(file_root + 8);
  uVar3 = *(undefined8 *)(file_root + 0x10);
  uVar4 = *(undefined8 *)(file_root + 0x18);
  uVar5 = *(undefined8 *)(file_root + 0x20);
  uVar6 = *(undefined8 *)(file_root + 0x28);
  ADesc->AvgBps = (int)uVar5;
  ADesc->LinkedTrackID = (int)((ulong)uVar5 >> 0x20);
  ADesc->ContainerDuration = (int)uVar6;
  ADesc->ChannelFormat = (int)((ulong)uVar6 >> 0x20);
  ADesc->Locked = (int)uVar3;
  ADesc->ChannelCount = (int)((ulong)uVar3 >> 0x20);
  ADesc->QuantizationBits = (int)uVar4;
  ADesc->BlockAlign = (int)((ulong)uVar4 >> 0x20);
  ADesc->EditRate = RVar1;
  ADesc->AudioSamplingRate = RVar2;
  if (in_R8D == 0) {
    local_43c = 1;
    ADesc[1].QuantizationBits = ADesc->ChannelCount;
  }
  else if (in_R8D == 1) {
    local_43c = ADesc->ChannelCount;
    ADesc[1].QuantizationBits = 1;
  }
  else if (in_R8D == 2) {
    if ((ADesc->ChannelCount & 1) != 0) {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error
                (this_00,"Unable to create 2-channel splits with odd number of input channels.\n");
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PARAM);
      goto LAB_0011209f;
    }
    local_43c = ADesc->ChannelCount >> 1;
    ADesc[1].QuantizationBits = 2;
  }
  bVar13 = false;
  if (local_43c != 0) {
    bVar13 = ADesc[1].QuantizationBits != 0;
  }
  if (!bVar13) {
    __assert_fail("file_count && m_ChannelCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/WavFileWriter.h"
                  ,0x89,
                  "ASDCP::Result_t WavFileWriter::OpenWrite(ASDCP::PCM::AudioDescriptor &, const char *, SplitType_t)"
                 );
  }
  uVar9 = ASDCP::PCM::CalcFrameBufferSize(ADesc);
  local_4bc = uVar9 / local_43c;
  if (in_R8D == 0) {
    snprintf(local_438,0x400,"%s");
    pWVar11 = (WavFileElement *)operator_new(0x68);
    WavFileElement::WavFileElement(pWVar11,local_4bc);
    local_4c8 = pWVar11;
    std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::push_back
              ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)(ADesc + 1),&local_4c8);
    std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::back
              ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)(ADesc + 1));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_550,local_438,(allocator<char> *)((long)&tmpDesc.ChannelFormat + 3));
    Kumu::FileWriter::OpenWrite(local_530);
    Kumu::Result_t::operator=(local_4a8,(Result_t *)local_530);
    Kumu::Result_t::~Result_t((Result_t *)local_530);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator((allocator<char> *)((long)&tmpDesc.ChannelFormat + 3));
    iVar10 = Kumu::Result_t::operator_cast_to_int(local_4a8);
    if (-1 < iVar10) {
      auStack_588 = *(undefined1 (*) [8])&ADesc->EditRate;
      tmpDesc.EditRate = ADesc->AudioSamplingRate;
      uVar7 = ADesc->Locked;
      tmpDesc.Locked = ADesc->QuantizationBits;
      tmpDesc.ChannelCount = ADesc->BlockAlign;
      tmpDesc.QuantizationBits = ADesc->AvgBps;
      tmpDesc.BlockAlign = ADesc->LinkedTrackID;
      tmpDesc.AvgBps = ADesc->ContainerDuration;
      tmpDesc.LinkedTrackID = ADesc->ChannelFormat;
      tmpDesc.AudioSamplingRate.Denominator = ADesc[1].QuantizationBits;
      tmpDesc.AudioSamplingRate.Numerator = uVar7;
      ASDCP::RF64::SimpleRF64Header::SimpleRF64Header(local_5a8,(AudioDescriptor *)auStack_588);
      std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::back
                ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)(ADesc + 1));
      ASDCP::RF64::SimpleRF64Header::WriteToFile(local_610);
      Kumu::Result_t::operator=(local_4a8,(Result_t *)local_610);
      Kumu::Result_t::~Result_t((Result_t *)local_610);
    }
  }
  else {
    local_614 = 0;
    while( true ) {
      bVar13 = false;
      if (local_614 < local_43c) {
        iVar10 = Kumu::Result_t::operator_cast_to_int(local_4a8);
        bVar13 = -1 < iVar10;
      }
      if (!bVar13) break;
      snprintf(local_438,0x400,"%s_%02u.wav",pcVar12,(ulong)(local_614 + 1));
      pWVar11 = (WavFileElement *)operator_new(0x68);
      WavFileElement::WavFileElement(pWVar11,local_4bc);
      local_620 = pWVar11;
      std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::push_back
                ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)(ADesc + 1),&local_620
                );
      std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::back
                ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)(ADesc + 1));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_6a8,local_438,&local_6a9);
      Kumu::FileWriter::OpenWrite(local_688);
      Kumu::Result_t::operator=(local_4a8,(Result_t *)local_688);
      Kumu::Result_t::~Result_t((Result_t *)local_688);
      std::__cxx11::string::~string(local_6a8);
      std::allocator<char>::~allocator(&local_6a9);
      iVar10 = Kumu::Result_t::operator_cast_to_int(local_4a8);
      if (-1 < iVar10) {
        auStack_6e8 = *(undefined1 (*) [8])&ADesc->EditRate;
        tmpDesc_1.EditRate = ADesc->AudioSamplingRate;
        uVar8 = ADesc->Locked;
        tmpDesc_1.Locked = ADesc->QuantizationBits;
        tmpDesc_1.ChannelCount = ADesc->BlockAlign;
        tmpDesc_1.QuantizationBits = ADesc->AvgBps;
        tmpDesc_1.BlockAlign = ADesc->LinkedTrackID;
        tmpDesc_1.AvgBps = ADesc->ContainerDuration;
        tmpDesc_1.LinkedTrackID = ADesc->ChannelFormat;
        tmpDesc_1.AudioSamplingRate.Denominator = ADesc[1].QuantizationBits;
        tmpDesc_1.AudioSamplingRate.Numerator = uVar8;
        ASDCP::RF64::SimpleRF64Header::SimpleRF64Header(local_708,(AudioDescriptor *)auStack_6e8);
        std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::back
                  ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)(ADesc + 1));
        ASDCP::RF64::SimpleRF64Header::WriteToFile(local_770);
        Kumu::Result_t::operator=(local_4a8,(Result_t *)local_770);
        Kumu::Result_t::~Result_t((Result_t *)local_770);
      }
      local_614 = local_614 + 1;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,local_4a8);
LAB_0011209f:
  local_4b8 = 1;
  Kumu::Result_t::~Result_t(local_4a8);
  return this;
}

Assistant:

ASDCP::Result_t
    OpenWrite(ASDCP::PCM::AudioDescriptor &ADesc, const char* file_root, SplitType_t split = ST_NONE)
    {
      ASDCP_TEST_NULL_STR(file_root);
      char filename[Kumu::MaxFilePath];
      ui32_t file_count = 0;
      ASDCP::Result_t result = ASDCP::RESULT_OK;
      m_ADesc = ADesc;

      switch ( split )
	{
	case ST_NONE:
	  file_count = 1;
	  m_ChannelCount = m_ADesc.ChannelCount;
	  break;

	case ST_MONO:
	  file_count = m_ADesc.ChannelCount;
	  m_ChannelCount = 1;
	  break;

	case ST_STEREO:
	  if ( m_ADesc.ChannelCount % 2 != 0 )
	    {
	      Kumu::DefaultLogSink().Error("Unable to create 2-channel splits with odd number of input channels.\n");
	      return ASDCP::RESULT_PARAM;
	    }

	  file_count = m_ADesc.ChannelCount / 2;
	  m_ChannelCount = 2;
	  break;
	}
      assert(file_count && m_ChannelCount);

      ui32_t element_size = ASDCP::PCM::CalcFrameBufferSize(m_ADesc) / file_count;
      if (split == ST_NONE)
      {
          snprintf(filename, Kumu::MaxFilePath, "%s", file_root);
          m_OutFile.push_back(new WavFileElement(element_size));
          result = m_OutFile.back()->OpenWrite(filename);
          if ( ASDCP_SUCCESS(result) )
          {
              ASDCP::PCM::AudioDescriptor tmpDesc = m_ADesc;
              tmpDesc.ChannelCount = m_ChannelCount;
              ASDCP::RF64::SimpleRF64Header Wav(tmpDesc);
              result = Wav.WriteToFile(*(m_OutFile.back()));
          }
      }
      else
      {
          for ( ui32_t i = 0; i < file_count && ASDCP_SUCCESS(result); i++ )
          {
              snprintf(filename, Kumu::MaxFilePath, "%s_%02u.wav", file_root, (i + 1));
              m_OutFile.push_back(new WavFileElement(element_size));
              result = m_OutFile.back()->OpenWrite(filename);

              if ( ASDCP_SUCCESS(result) )
              {
                  ASDCP::PCM::AudioDescriptor tmpDesc = m_ADesc;
                  tmpDesc.ChannelCount = m_ChannelCount;
                  ASDCP::RF64::SimpleRF64Header Wav(tmpDesc);
                  result = Wav.WriteToFile(*(m_OutFile.back()));
              }
          }
      }
      return result;
    }